

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O2

string * __thiscall
yactfr::internal::ReadFlUIntInstr::_toStr_abi_cxx11_
          (string *__return_storage_ptr__,ReadFlUIntInstr *this,Size param_1)

{
  ostream *poVar1;
  ostringstream ss;
  string sStack_1a8;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  ReadFlBitArrayInstr::_commonToStr_abi_cxx11_(&sStack_1a8,(ReadFlBitArrayInstr *)this);
  poVar1 = std::operator<<((ostream *)local_188,(string *)&sStack_1a8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __return_storage_ptr__;
}

Assistant:

std::string ReadFlUIntInstr::_toStr(Size) const
{
    std::ostringstream ss;

    ss << this->_commonToStr() << std::endl;
    return ss.str();
}